

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O0

Ivy_Man_t * Ivy_ManFrames(Ivy_Man_t *pMan,int nLatches,int nFrames,int fInit,Vec_Ptr_t **pvMapping)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Ivy_Man_t *p;
  Ivy_Obj_t *pIVar5;
  Vec_Ptr_t *p_00;
  Ivy_Obj_t *pIVar6;
  Ivy_Obj_t *p1;
  void *pvVar7;
  Ivy_Obj_t *local_60;
  int nIdMax;
  int nPos;
  int nPis;
  int f;
  int i;
  Ivy_Obj_t *pObj;
  Ivy_Man_t *pNew;
  Vec_Ptr_t *vMapping;
  Vec_Ptr_t **pvMapping_local;
  int fInit_local;
  int nFrames_local;
  int nLatches_local;
  Ivy_Man_t *pMan_local;
  
  iVar1 = Ivy_ManLatchNum(pMan);
  if (iVar1 != 0) {
    __assert_fail("Ivy_ManLatchNum(pMan) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                  ,0xb2,"Ivy_Man_t *Ivy_ManFrames(Ivy_Man_t *, int, int, int, Vec_Ptr_t **)");
  }
  if (0 < nFrames) {
    iVar1 = Ivy_ManPiNum(pMan);
    iVar2 = Ivy_ManPoNum(pMan);
    iVar2 = iVar2 - nLatches;
    iVar3 = Ivy_ManObjIdMax(pMan);
    p = Ivy_ManStart();
    for (nPis = 0; nPis < nLatches; nPis = nPis + 1) {
      if (fInit == 0) {
        local_60 = Ivy_ObjCreatePi(p);
      }
      else {
        pIVar5 = Ivy_ManConst1(p);
        local_60 = Ivy_Not(pIVar5);
      }
      pIVar5 = Ivy_ManPo(pMan,iVar2 + nPis);
      pIVar5->pEquiv = local_60;
    }
    p_00 = Vec_PtrStart(iVar3 * nFrames + 1);
    for (nPos = 0; nPos < nFrames; nPos = nPos + 1) {
      pIVar5 = Ivy_ManConst1(p);
      pIVar6 = Ivy_ManConst1(pMan);
      pIVar6->pEquiv = pIVar5;
      for (nPis = 0; nPis < iVar1 - nLatches; nPis = nPis + 1) {
        pIVar5 = Ivy_ObjCreatePi(p);
        pIVar6 = Ivy_ManPi(pMan,nPis);
        pIVar6->pEquiv = pIVar5;
      }
      for (nPis = 0; nPis < nLatches; nPis = nPis + 1) {
        pIVar5 = Ivy_ManPo(pMan,iVar2 + nPis);
        pIVar5 = pIVar5->pEquiv;
        pIVar6 = Ivy_ManPi(pMan,(iVar1 - nLatches) + nPis);
        pIVar6->pEquiv = pIVar5;
      }
      for (nPis = 0; iVar4 = Vec_PtrSize(pMan->vObjs), nPis < iVar4; nPis = nPis + 1) {
        pIVar5 = (Ivy_Obj_t *)Vec_PtrEntry(pMan->vObjs,nPis);
        if ((pIVar5 != (Ivy_Obj_t *)0x0) && (iVar4 = Ivy_ObjIsNode(pIVar5), iVar4 != 0)) {
          pIVar6 = Ivy_ObjChild0Equiv(pIVar5);
          p1 = Ivy_ObjChild1Equiv(pIVar5);
          pIVar6 = Ivy_And(p,pIVar6,p1);
          pIVar5->pEquiv = pIVar6;
        }
      }
      for (nPis = 0; nPis < iVar2; nPis = nPis + 1) {
        pIVar5 = Ivy_ManPo(pMan,nPis);
        pIVar5 = Ivy_ObjChild0Equiv(pIVar5);
        pIVar5 = Ivy_ObjCreatePo(p,pIVar5);
        pIVar6 = Ivy_ManPo(pMan,nPis);
        pIVar6->pEquiv = pIVar5;
      }
      for (nPis = 0; nPis < nLatches; nPis = nPis + 1) {
        pIVar5 = Ivy_ManPo(pMan,iVar2 + nPis);
        pIVar5 = Ivy_ObjChild0Equiv(pIVar5);
        pIVar6 = Ivy_ManPo(pMan,iVar2 + nPis);
        pIVar6->pEquiv = pIVar5;
      }
      for (nPis = 0; iVar4 = Vec_PtrSize(pMan->vObjs), nPis < iVar4; nPis = nPis + 1) {
        pvVar7 = Vec_PtrEntry(pMan->vObjs,nPis);
        if (pvVar7 != (void *)0x0) {
          Vec_PtrWriteEntry(p_00,nPos * iVar3 + nPis,*(void **)((long)pvVar7 + 0x48));
        }
      }
    }
    if (fInit == 0) {
      for (nPis = 0; nPis < nLatches; nPis = nPis + 1) {
        pIVar5 = Ivy_ManPo(pMan,iVar2 + nPis);
        Ivy_ObjCreatePo(p,pIVar5->pEquiv);
      }
    }
    Ivy_ManCleanup(p);
    *pvMapping = p_00;
    iVar1 = Ivy_ManCheck(p);
    if (iVar1 == 0) {
      printf("Ivy_ManFrames(): The check has failed.\n");
    }
    return p;
  }
  __assert_fail("nFrames > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyMan.c"
                ,0xb3,"Ivy_Man_t *Ivy_ManFrames(Ivy_Man_t *, int, int, int, Vec_Ptr_t **)");
}

Assistant:

Ivy_Man_t * Ivy_ManFrames( Ivy_Man_t * pMan, int nLatches, int nFrames, int fInit, Vec_Ptr_t ** pvMapping )
{
    Vec_Ptr_t * vMapping;
    Ivy_Man_t * pNew;
    Ivy_Obj_t * pObj;
    int i, f, nPis, nPos, nIdMax;
    assert( Ivy_ManLatchNum(pMan) == 0 );
    assert( nFrames > 0 );
    // prepare the mapping
    nPis = Ivy_ManPiNum(pMan) - nLatches;
    nPos = Ivy_ManPoNum(pMan) - nLatches;
    nIdMax = Ivy_ManObjIdMax(pMan);
    // create the new manager
    pNew = Ivy_ManStart();
    // set the starting values of latch inputs
    for ( i = 0; i < nLatches; i++ )
        Ivy_ManPo(pMan, nPos+i)->pEquiv = fInit? Ivy_Not(Ivy_ManConst1(pNew)) : Ivy_ObjCreatePi(pNew);
    // add timeframes
    vMapping = Vec_PtrStart( nIdMax * nFrames + 1 );
    for ( f = 0; f < nFrames; f++ )
    {
        // create PIs
        Ivy_ManConst1(pMan)->pEquiv = Ivy_ManConst1(pNew);
        for ( i = 0; i < nPis; i++ )
            Ivy_ManPi(pMan, i)->pEquiv = Ivy_ObjCreatePi(pNew);
        // transfer values to latch outputs
        for ( i = 0; i < nLatches; i++ )
            Ivy_ManPi(pMan, nPis+i)->pEquiv = Ivy_ManPo(pMan, nPos+i)->pEquiv;
        // perform strashing
        Ivy_ManForEachNode( pMan, pObj, i )
            pObj->pEquiv = Ivy_And( pNew, Ivy_ObjChild0Equiv(pObj), Ivy_ObjChild1Equiv(pObj) );
        // create POs
        for ( i = 0; i < nPos; i++ )
            Ivy_ManPo(pMan, i)->pEquiv = Ivy_ObjCreatePo( pNew, Ivy_ObjChild0Equiv(Ivy_ManPo(pMan, i)) );
        // set the results of latch inputs
        for ( i = 0; i < nLatches; i++ )
            Ivy_ManPo(pMan, nPos+i)->pEquiv = Ivy_ObjChild0Equiv(Ivy_ManPo(pMan, nPos+i));
        // save the pointers in this frame
        Ivy_ManForEachObj( pMan, pObj, i )
            Vec_PtrWriteEntry( vMapping, f * nIdMax + i, pObj->pEquiv );
    }
    // connect latches
    if ( !fInit )
        for ( i = 0; i < nLatches; i++ )
            Ivy_ObjCreatePo( pNew, Ivy_ManPo(pMan, nPos+i)->pEquiv );
    // remove dangling nodes
    Ivy_ManCleanup(pNew);
    *pvMapping = vMapping;
    // check the resulting network
    if ( !Ivy_ManCheck(pNew) )
        printf( "Ivy_ManFrames(): The check has failed.\n" );
    return pNew;
}